

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cpp
# Opt level: O2

void flatbuffers::tests::anon_unknown_1::NumericUtilsTestFloat<float>(char *lower,char *upper)

{
  bool bVar1;
  undefined7 in_register_00000001;
  float f;
  
  f = (float)((uint7)in_register_00000001 >> 0x18);
  bVar1 = StringToFloatImpl<float>(&f,"");
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1b,"");
  bVar1 = StringToFloatImpl<float>(&f,"1q");
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"1q\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1c,"");
  TestEq<float,int>(f,0,"\'f\' != \'0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1d,"");
  bVar1 = StringToFloatImpl<float>(&f,upper);
  TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(upper, &f)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1e,"");
  TestEq<float,float>(f,INFINITY,"\'f\' != \'+flatbuffers::numeric_limits<T>::infinity()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x1f,"");
  bVar1 = StringToFloatImpl<float>(&f,lower);
  TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(lower, &f)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x20,"");
  TestEq<float,float>(f,-INFINITY,"\'f\' != \'-flatbuffers::numeric_limits<T>::infinity()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x21,"");
  return;
}

Assistant:

void NumericUtilsTestFloat(const char *lower, const char *upper) {
  T f;
  TEST_EQ(flatbuffers::StringToNumber("", &f), false);
  TEST_EQ(flatbuffers::StringToNumber("1q", &f), false);
  TEST_EQ(f, 0);
  TEST_EQ(flatbuffers::StringToNumber(upper, &f), true);
  TEST_EQ(f, +flatbuffers::numeric_limits<T>::infinity());
  TEST_EQ(flatbuffers::StringToNumber(lower, &f), true);
  TEST_EQ(f, -flatbuffers::numeric_limits<T>::infinity());
}